

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

void affect_remove(CHAR_DATA *ch,AFFECT_DATA *paf)

{
  short sVar1;
  AFFECT_DATA *pAVar2;
  AFFECT_DATA *pAVar3;
  string_view fmt;
  string_view fmt_00;
  long vector [2];
  
  if (ch->affected == (AFFECT_DATA *)0x0) {
    fmt._M_str = "Affect_remove: no affect on {}.";
    fmt._M_len = 0x1f;
    CLogger::Warn<char*&>((CLogger *)&RS.field_0x140,fmt,&ch->name);
    return;
  }
  if (paf->end_fun != (AFF_FUN *)0x0) {
    (*paf->end_fun)(ch,paf);
  }
  affect_modify(ch,paf,false);
  sVar1 = paf->where;
  copy_vector(vector,paf->bitvector);
  pAVar2 = ch->affected;
  if (ch->affected == paf) {
    pAVar3 = (AFFECT_DATA *)&ch->affected;
  }
  else {
    do {
      pAVar3 = pAVar2;
      if (pAVar3 == (AFFECT_DATA *)0x0) {
        fmt_00._M_str = "Affect_remove: cannot find paf.";
        fmt_00._M_len = 0x1f;
        CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_00);
        return;
      }
      pAVar2 = pAVar3->next;
    } while (pAVar3->next != paf);
  }
  pAVar3->next = paf->next;
  free_affect(paf);
  affect_check(ch,(int)sVar1,vector);
  return;
}

Assistant:

void affect_remove(CHAR_DATA *ch, AFFECT_DATA *paf)
{
	int where;
	long vector[MAX_BITVECTOR];

	if (ch->affected == nullptr)
	{
		RS.Logger.Warn("Affect_remove: no affect on {}.", ch->name);
		return;
	}

	if (paf->end_fun != nullptr)
		(*paf->end_fun)(ch, paf);

	affect_modify(ch, paf, false);
	where = paf->where;
	copy_vector(vector, paf->bitvector);

	if (paf == ch->affected)
	{
		ch->affected = paf->next;
	}
	else
	{
		AFFECT_DATA *prev;

		for (prev = ch->affected; prev != nullptr; prev = prev->next)
		{
			if (prev->next == paf)
			{
				prev->next = paf->next;
				break;
			}
		}

		if (prev == nullptr)
		{
			RS.Logger.Warn("Affect_remove: cannot find paf.");
			return;
		}
	}

	free_affect(paf);
	affect_check(ch, where, vector);
}